

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O2

void brotli::EmitLongInsertLen
               (size_t insertlen,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  size_t n_bits;
  bool bVar1;
  
  bVar1 = insertlen < 0x5842;
  n_bits = 0x18;
  if (bVar1) {
    n_bits = 0xe;
  }
  WriteBits((ulong)depth[(ulong)bVar1 ^ 0x3f],(ulong)bits[(ulong)!bVar1 + 0x3e],storage_ix,storage);
  WriteBits(n_bits,((ulong)bVar1 << 0xe | 0xffffffffffffa7be) + insertlen,storage_ix,storage);
  histo[(ulong)!bVar1 + 0x16] = histo[(ulong)!bVar1 + 0x16] + 1;
  return;
}

Assistant:

inline void EmitLongInsertLen(size_t insertlen,
                              const uint8_t depth[128],
                              const uint16_t bits[128],
                              uint32_t histo[128],
                              size_t* storage_ix,
                              uint8_t* storage) {
  if (insertlen < 22594) {
    WriteBits(depth[62], bits[62], storage_ix, storage);
    WriteBits(14, insertlen - 6210, storage_ix, storage);
    ++histo[22];
  } else {
    WriteBits(depth[63], bits[63], storage_ix, storage);
    WriteBits(24, insertlen - 22594, storage_ix, storage);
    ++histo[23];
  }
}